

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O0

int ecdsa_sign_proxy(int type,uchar *m,int m_len,uchar *_sigret,uint *_siglen,BIGNUM *kinv,
                    BIGNUM *rp,EC_KEY *ec_key)

{
  int iVar1;
  int *piVar2;
  void *__src;
  char *pcVar3;
  uchar *sigret;
  size_t siglen;
  size_t ret;
  expbuf_t buf;
  st_neverbleed_thread_data_t *thdata;
  st_neverbleed_rsa_exdata_t *exdata;
  BIGNUM *kinv_local;
  uint *_siglen_local;
  uchar *_sigret_local;
  uchar *puStack_18;
  int m_len_local;
  uchar *m_local;
  int type_local;
  
  exdata = (st_neverbleed_rsa_exdata_t *)kinv;
  kinv_local = (BIGNUM *)_siglen;
  _siglen_local = (uint *)_sigret;
  _sigret_local._4_4_ = m_len;
  puStack_18 = m;
  m_local._4_4_ = type;
  memset(&ret,0,0x20);
  ecdsa_get_privsep_data
            (ec_key,(st_neverbleed_rsa_exdata_t **)&thdata,
             (st_neverbleed_thread_data_t **)&buf.capacity);
  if ((exdata != (st_neverbleed_rsa_exdata_t *)0x0) || (rp != (BIGNUM *)0x0)) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    dief("unexpected non-NULL kinv and rp");
  }
  expbuf_push_str((expbuf_t *)&ret,"ecdsa_sign");
  expbuf_push_num((expbuf_t *)&ret,(long)m_local._4_4_);
  expbuf_push_bytes((expbuf_t *)&ret,puStack_18,(long)_sigret_local._4_4_);
  expbuf_push_num((expbuf_t *)&ret,(size_t)thdata[1]);
  iVar1 = expbuf_write((expbuf_t *)&ret,*(int *)(buf.capacity + 4));
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    pcVar3 = "connection closed by daemon";
    if (*piVar2 != 0) {
      pcVar3 = "write error";
    }
    dief(pcVar3);
  }
  expbuf_dispose((expbuf_t *)&ret);
  iVar1 = expbuf_read((expbuf_t *)&ret,*(int *)(buf.capacity + 4));
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    pcVar3 = "connection closed by daemon";
    if (*piVar2 != 0) {
      pcVar3 = "read error";
    }
    dief(pcVar3);
  }
  iVar1 = expbuf_shift_num((expbuf_t *)&ret,&siglen);
  if (iVar1 == 0) {
    __src = expbuf_shift_bytes((expbuf_t *)&ret,(size_t *)&sigret);
    if (__src != (void *)0x0) {
      memcpy(_siglen_local,__src,(size_t)sigret);
      *(int *)kinv_local = (int)sigret;
      expbuf_dispose((expbuf_t *)&ret);
      return (int)siglen;
    }
  }
  piVar2 = __errno_location();
  *piVar2 = 0;
  dief("failed to parse response");
}

Assistant:

static int ecdsa_sign_proxy(int type, const unsigned char *m, int m_len, unsigned char *_sigret, unsigned int *_siglen,
                            const BIGNUM *kinv, const BIGNUM *rp, EC_KEY *ec_key)
{
    struct st_neverbleed_rsa_exdata_t *exdata;
    struct st_neverbleed_thread_data_t *thdata;
    struct expbuf_t buf = {};
    size_t ret, siglen;
    unsigned char *sigret;

    ecdsa_get_privsep_data(ec_key, &exdata, &thdata);

    /* as far as I've tested so far, kinv and rp are always NULL.
       Looks like setup_sign will precompute this, but it is only
       called sign_sig, and it seems to be not used in TLS ECDSA */
    if (kinv != NULL || rp != NULL) {
        errno = 0;
        dief("unexpected non-NULL kinv and rp");
    }

    expbuf_push_str(&buf, "ecdsa_sign");
    expbuf_push_num(&buf, type);
    expbuf_push_bytes(&buf, m, m_len);
    expbuf_push_num(&buf, exdata->key_index);
    if (expbuf_write(&buf, thdata->fd) != 0)
        dief(errno != 0 ? "write error" : "connection closed by daemon");
    expbuf_dispose(&buf);

    if (expbuf_read(&buf, thdata->fd) != 0)
        dief(errno != 0 ? "read error" : "connection closed by daemon");
    if (expbuf_shift_num(&buf, &ret) != 0 || (sigret = expbuf_shift_bytes(&buf, &siglen)) == NULL) {
        errno = 0;
        dief("failed to parse response");
    }
    memcpy(_sigret, sigret, siglen);
    *_siglen = (unsigned)siglen;
    expbuf_dispose(&buf);

    return (int)ret;
}